

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timecode.h
# Opt level: O0

void __thiscall ViconCGStream::VTimecode::VTimecode(VTimecode *this)

{
  VTimecode *this_local;
  
  VItem::VItem(&this->super_VItem);
  (this->super_VItem)._vptr_VItem = (_func_int **)&PTR_TypeID_002a0718;
  this->m_Hours = '\0';
  this->m_Minutes = '\0';
  this->m_Seconds = '\0';
  this->m_Frames = '\0';
  this->m_Subframes = 0;
  this->m_SubframesPerFrame = 0;
  this->m_UserBits = 0;
  this->m_FieldFlag = '\0';
  this->m_Standard = 0xffffffff;
  return;
}

Assistant:

VTimecode()
  : m_Hours( 0 )
  , m_Minutes( 0 )
  , m_Seconds( 0 )
  , m_Frames( 0 )
  , m_Subframes( 0 )
  , m_SubframesPerFrame( 0 )
  , m_UserBits( 0 )
  , m_FieldFlag( 0 )
  , m_Standard( ETimecodeNone )
  {
  }